

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

TokenOrSyntax * __thiscall
slang::syntax::PackageExportAllDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,PackageExportAllDeclarationSyntax *this,
          size_t index)

{
  Token local_20;
  
  switch(index) {
  case 0:
    *(SyntaxNode **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\x01';
    return __return_storage_ptr__;
  case 1:
    local_20.kind = (this->keyword).kind;
    local_20._2_1_ = (this->keyword).field_0x2;
    local_20.numFlags.raw = (this->keyword).numFlags.raw;
    local_20.rawLen = (this->keyword).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->keyword).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->keyword).info + 4);
    break;
  case 2:
    local_20.kind = (this->star1).kind;
    local_20._2_1_ = (this->star1).field_0x2;
    local_20.numFlags.raw = (this->star1).numFlags.raw;
    local_20.rawLen = (this->star1).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->star1).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->star1).info + 4);
    break;
  case 3:
    local_20.kind = (this->doubleColon).kind;
    local_20._2_1_ = (this->doubleColon).field_0x2;
    local_20.numFlags.raw = (this->doubleColon).numFlags.raw;
    local_20.rawLen = (this->doubleColon).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->doubleColon).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->doubleColon).info + 4);
    break;
  case 4:
    local_20.kind = (this->star2).kind;
    local_20._2_1_ = (this->star2).field_0x2;
    local_20.numFlags.raw = (this->star2).numFlags.raw;
    local_20.rawLen = (this->star2).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->star2).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->star2).info + 4);
    break;
  case 5:
    local_20.kind = (this->semi).kind;
    local_20._2_1_ = (this->semi).field_0x2;
    local_20.numFlags.raw = (this->semi).numFlags.raw;
    local_20.rawLen = (this->semi).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->semi).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->semi).info + 4);
    break;
  default:
    parsing::Token::Token(&local_20);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       local_20._0_4_;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
       local_20.rawLen;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
       local_20.info._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc) =
       local_20.info._4_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax PackageExportAllDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return star1;
        case 3: return doubleColon;
        case 4: return star2;
        case 5: return semi;
        default: return nullptr;
    }
}